

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O0

void __thiscall trng::yarn4::jump2(yarn4 *this,uint s)

{
  uint in_ESI;
  int32_t *in_RDI;
  result_type d [4];
  result_type r [4];
  uint i;
  result_type c [16];
  result_type b [16];
  int32_t local_c8;
  int32_t local_c4;
  int32_t local_c0;
  int32_t local_bc;
  int32_t local_b8;
  int32_t local_b4;
  int32_t local_b0;
  int32_t local_ac;
  uint local_9c;
  int32_t local_98 [16];
  int32_t local_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c;
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  int32_t local_30;
  int32_t local_2c;
  int32_t local_28;
  int32_t local_24;
  int32_t local_20;
  int32_t local_1c;
  uint local_c;
  
  local_c = in_ESI;
  memset(local_98,0,0x40);
  local_58 = *in_RDI;
  local_54 = in_RDI[1];
  local_50 = in_RDI[2];
  local_4c = in_RDI[3];
  local_48 = 1;
  local_44 = 0;
  local_40 = 0;
  local_3c = 0;
  local_38 = 0;
  local_34 = 1;
  local_30 = 0;
  local_2c = 0;
  local_28 = 0;
  local_24 = 0;
  local_20 = 1;
  local_1c = 0;
  for (local_9c = 0; local_9c < local_c; local_9c = local_9c + 1) {
    int_math::matrix_mult<4>
              ((int32_t (*) [16])&local_58,(int32_t (*) [16])&local_58,&local_98,0x7fffffff);
    local_9c = local_9c + 1;
    if (local_c <= local_9c) break;
    int_math::matrix_mult<4>(&local_98,&local_98,(int32_t (*) [16])&local_58,0x7fffffff);
  }
  local_b8 = in_RDI[4];
  local_b4 = in_RDI[5];
  local_b0 = in_RDI[6];
  local_ac = in_RDI[7];
  if ((local_c & 1) == 0) {
    int_math::matrix_vec_mult<4>
              ((int32_t (*) [16])&local_58,(int32_t (*) [4])&local_b8,(int32_t (*) [4])&local_c8,
               0x7fffffff);
  }
  else {
    int_math::matrix_vec_mult<4>
              (&local_98,(int32_t (*) [4])&local_b8,(int32_t (*) [4])&local_c8,0x7fffffff);
  }
  in_RDI[4] = local_c8;
  in_RDI[5] = local_c4;
  in_RDI[6] = local_c0;
  in_RDI[7] = local_bc;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::jump2(unsigned int s) {
    result_type b[16], c[16]{};
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = P.a[3];
    b[4] = 1;
    b[5] = 0;
    b[6] = 0;
    b[7] = 0;
    b[8] = 0;
    b[9] = 1;
    b[10] = 0;
    b[11] = 0;
    b[12] = 0;
    b[13] = 0;
    b[14] = 1;
    b[15] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<4>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<4>(c, c, b, modulus);
    }
    const result_type r[4]{S.r[0], S.r[1], S.r[2], S.r[3]};
    result_type d[4];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<4>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<4>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
    S.r[3] = d[3];
  }